

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patternprops.cpp
# Opt level: O0

UBool icu_63::PatternProps::isWhiteSpace(UChar32 c)

{
  bool local_11;
  bool local_9;
  UChar32 c_local;
  
  if (c < 0) {
    local_9 = false;
  }
  else if (c < 0x100) {
    local_9 = (bool)((byte)((int)(uint)(byte)latin1[c] >> 2) & 1);
  }
  else if ((c < 0x200e) || (0x2029 < c)) {
    local_9 = false;
  }
  else {
    local_11 = c < 0x2010 || 0x2027 < c;
    local_9 = local_11;
  }
  return local_9;
}

Assistant:

UBool
PatternProps::isWhiteSpace(UChar32 c) {
    if(c<0) {
        return FALSE;
    } else if(c<=0xff) {
        return (UBool)(latin1[c]>>2)&1;
    } else if(0x200e<=c && c<=0x2029) {
        return c<=0x200f || 0x2028<=c;
    } else {
        return FALSE;
    }
}